

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

uint8_t * __thiscall
google::protobuf::internal::ExtensionSet::_InternalSerializeImpl
          (ExtensionSet *this,MessageLite *extendee,int start_field_number,int end_field_number,
          uint8_t *target,EpsCopyOutputStream *stream)

{
  bool bVar1;
  KeyValue *pKVar2;
  KeyValue *local_48;
  KeyValue *it;
  KeyValue *end;
  EpsCopyOutputStream *stream_local;
  uint8_t *target_local;
  int end_field_number_local;
  int start_field_number_local;
  MessageLite *extendee_local;
  ExtensionSet *this_local;
  
  bVar1 = is_large(this);
  if (bVar1) {
    this_local = (ExtensionSet *)
                 _InternalSerializeImplLarge
                           (this,extendee,start_field_number,end_field_number,target,stream);
  }
  else {
    pKVar2 = flat_end(this);
    local_48 = flat_begin(this);
    while( true ) {
      bVar1 = false;
      if (local_48 != pKVar2) {
        bVar1 = local_48->first < start_field_number;
      }
      stream_local = (EpsCopyOutputStream *)target;
      if (!bVar1) break;
      local_48 = local_48 + 1;
    }
    while( true ) {
      bVar1 = false;
      if (local_48 != pKVar2) {
        bVar1 = local_48->first < end_field_number;
      }
      if (!bVar1) break;
      stream_local = (EpsCopyOutputStream *)
                     Extension::InternalSerializeFieldWithCachedSizesToArray
                               (&local_48->second,extendee,this,local_48->first,
                                (uint8_t *)stream_local,stream);
      local_48 = local_48 + 1;
    }
    this_local = (ExtensionSet *)stream_local;
  }
  return (uint8_t *)this_local;
}

Assistant:

uint8_t* ExtensionSet::_InternalSerializeImpl(
    const MessageLite* extendee, int start_field_number, int end_field_number,
    uint8_t* target, io::EpsCopyOutputStream* stream) const {
  if (ABSL_PREDICT_FALSE(is_large())) {
    return _InternalSerializeImplLarge(extendee, start_field_number,
                                       end_field_number, target, stream);
  }
  const KeyValue* end = flat_end();
  const KeyValue* it = flat_begin();
  while (it != end && it->first < start_field_number) ++it;
  for (; it != end && it->first < end_field_number; ++it) {
    target = it->second.InternalSerializeFieldWithCachedSizesToArray(
        extendee, this, it->first, target, stream);
  }
  return target;
}